

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
::operator=(SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
            *this,SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                  *RHS)

{
  U *pUVar1;
  undefined4 *puVar2;
  undefined1 *__ptr;
  undefined4 *puVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined4 *puVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long lVar11;
  ulong MinSize;
  undefined4 *puVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (this == RHS) {
    return this;
  }
  puVar2 = (undefined4 *)
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
           .super_SmallVectorBase.BeginX;
  pUVar1 = &(RHS->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
            ).
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
            .FirstEl;
  if ((U *)puVar2 != pUVar1) {
    __ptr = (undefined1 *)
            (this->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
            ).
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
            .super_SmallVectorBase.BeginX;
    if ((U *)__ptr !=
        &(this->
         super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
         ).
         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
         .FirstEl) {
      free(__ptr);
    }
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
    .super_SmallVectorBase.BeginX =
         (RHS->
         super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
         ).
         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
         .super_SmallVectorBase.BeginX;
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX =
         (RHS->
         super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
         ).
         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
         .super_SmallVectorBase.EndX;
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
    .super_SmallVectorBase.CapacityX =
         (RHS->
         super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
         ).
         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
         .super_SmallVectorBase.CapacityX;
    (RHS->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
    .super_SmallVectorBase.CapacityX = pUVar1;
    (RHS->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX = pUVar1;
    (RHS->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
    .super_SmallVectorBase.BeginX = pUVar1;
    return this;
  }
  puVar7 = (undefined4 *)
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  uVar14 = (long)puVar7 - (long)puVar2;
  MinSize = ((long)uVar14 >> 3) * -0x5555555555555555;
  puVar12 = (undefined4 *)
            (this->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
            ).
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
            .super_SmallVectorBase.BeginX;
  puVar3 = (undefined4 *)
           (this->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  uVar6 = (long)puVar3 - (long)puVar12;
  uVar13 = ((long)uVar6 >> 3) * -0x5555555555555555;
  if (MinSize <= uVar13) {
    if (0 < (long)uVar14 && puVar7 != puVar2) {
      lVar8 = uVar14 / 0x18 + 1;
      puVar7 = puVar2;
      do {
        *puVar12 = *puVar7;
        *(undefined8 *)(puVar12 + 2) = *(undefined8 *)(puVar7 + 2);
        *(undefined8 *)(puVar12 + 4) = *(undefined8 *)(puVar7 + 4);
        puVar7 = puVar7 + 6;
        puVar12 = puVar12 + 6;
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX = puVar12;
    (RHS->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX = puVar2;
    return this;
  }
  if ((ulong)((long)(this->
                    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                    .super_SmallVectorBase.CapacityX - (long)puVar12) < uVar14) {
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX = puVar12;
    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ::grow(&this->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
           ,MinSize);
  }
  else if (puVar3 != puVar12) {
    if (0 < (long)uVar6) {
      lVar11 = uVar6 / 0x18 + 1;
      lVar8 = 0;
      do {
        *(undefined4 *)((long)puVar12 + lVar8) = *(undefined4 *)((long)puVar2 + lVar8);
        *(undefined8 *)((long)puVar12 + lVar8 + 8) = *(undefined8 *)((long)puVar2 + lVar8 + 8);
        *(undefined8 *)((long)puVar12 + lVar8 + 0x10) = *(undefined8 *)((long)puVar2 + lVar8 + 0x10)
        ;
        lVar11 = lVar11 + -1;
        lVar8 = lVar8 + 0x18;
      } while (1 < lVar11);
    }
    goto LAB_008e2be3;
  }
  uVar13 = 0;
LAB_008e2be3:
  puVar10 = (undefined8 *)
            ((long)(RHS->
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                   ).
                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                   .super_SmallVectorBase.BeginX + uVar13 * 0x18);
  puVar4 = (undefined8 *)
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  if (puVar10 != puVar4) {
    puVar9 = (undefined8 *)
             (uVar13 * 0x18 +
             (long)(this->
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                   ).
                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                   .super_SmallVectorBase.BeginX);
    do {
      puVar9[2] = puVar10[2];
      uVar5 = puVar10[1];
      *puVar9 = *puVar10;
      puVar9[1] = uVar5;
      puVar10 = puVar10 + 3;
      puVar9 = puVar9 + 3;
    } while (puVar10 != puVar4);
  }
  (this->
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
  ).
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX =
       (void *)(uVar14 + (long)(this->
                               super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                               ).
                               super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                               .super_SmallVectorBase.BeginX);
  (RHS->
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
  ).
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX =
       (RHS->
       super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
       ).
       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
       .super_SmallVectorBase.BeginX;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->EndX = RHS.EndX;
    this->CapacityX = RHS.CapacityX;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->setEnd(NewEnd);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);

  RHS.clear();
  return *this;
}